

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::MultiAggregationPS::execute
          (MultiAggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  Nonzero<double> *pNVar6;
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  double dVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  undefined1 auVar12 [16];
  double local_68;
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar5 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    rStatus->data[iVar2] = rStatus->data[iVar1];
  }
  iVar1 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar1 != iVar2) {
    pdVar5 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    pdVar5 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    cStatus->data[iVar2] = cStatus->data[iVar1];
  }
  pNVar6 = (this->m_row).super_SVectorBase<double>.m_elem;
  uVar3 = (this->m_row).super_SVectorBase<double>.memused;
  dVar10 = 0.0;
  local_68 = 0.0;
  if (pNVar6 != (Nonzero<double> *)0x0) {
    if ((int)uVar3 < 1) {
      local_68 = 0.0;
      goto LAB_00201bd3;
    }
    lVar8 = 0;
    do {
      if (*(int *)((long)&pNVar6->idx + lVar8) == iVar1) {
        local_68 = *(double *)((long)&pNVar6->val + lVar8);
        goto LAB_00201b9a;
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar8);
    local_68 = 0.0;
  }
LAB_00201b9a:
  if (0 < (int)uVar3) {
    dVar10 = 0.0;
    lVar8 = 0;
    do {
      iVar2 = *(int *)((long)&pNVar6->idx + lVar8);
      if (iVar2 != iVar1) {
        dVar10 = dVar10 + *(double *)((long)&pNVar6->val + lVar8) *
                          (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar2];
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar8);
  }
LAB_00201bd3:
  dVar11 = ABS(this->m_const);
  auVar12._8_8_ = dVar10;
  auVar12._0_8_ = this->m_const;
  if (dVar11 <= ABS(dVar10)) {
    dVar11 = ABS(dVar10);
  }
  dVar10 = 1.0;
  if (1.0 <= dVar11) {
    dVar10 = dVar11;
  }
  auVar7._8_8_ = dVar10;
  auVar7._0_8_ = dVar10;
  auVar12 = divpd(auVar12,auVar7);
  dVar11 = auVar12._0_8_ - auVar12._8_8_;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  iVar1 = this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] =
       ((double)(~-(ulong)(ABS(dVar11) <= extraout_XMM0_Qa) & (ulong)dVar11) * dVar10) / local_68;
  iVar2 = this->m_i;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = 0.0;
  lVar8 = (long)(this->m_col).super_SVectorBase<double>.memused;
  pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar8 < 1) {
    dVar10 = 0.0;
  }
  else {
    pNVar6 = (this->m_col).super_SVectorBase<double>.m_elem;
    dVar10 = 0.0;
    lVar9 = 0;
    do {
      iVar4 = *(int *)((long)&pNVar6->idx + lVar9);
      if (iVar4 != iVar2) {
        dVar10 = dVar10 + *(double *)((long)&pNVar6->val + lVar9) * pdVar5[iVar4];
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar8 * 0x10 != lVar9);
  }
  pdVar5[iVar2] = (this->m_obj - dVar10) / local_68;
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = 0.0;
  cStatus->data[iVar1] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[iVar2] = ON_LOWER;
    }
    else {
      rStatus->data[iVar2] = ON_UPPER;
    }
  }
  else {
    rStatus->data[iVar2] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::MultiAggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_const, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_const / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = 0.0;

#ifndef NDEBUG

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
      SPX_MSG_ERROR(std::cerr << "numerical violation in original space due to MultiAggregation\n";)
#endif

      // dual:
      R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}